

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

void print_current(ostream *os,Am_Priority_List_Item *current)

{
  ostream *poVar1;
  Am_Priority_List_Item *current_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,current->main_priority);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,current->second_priority);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,current->third_priority);
  poVar1 = std::operator<<(poVar1,")");
  poVar1 = operator<<(poVar1,&current->obj);
  std::operator<<(poVar1," ");
  return;
}

Assistant:

void
print_current(std::ostream &os, Am_Priority_List_Item *current)
{
  os << "(" << current->main_priority << "," << current->second_priority << ","
     << current->third_priority << ")" << current->obj << " ";
}